

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

GenerateBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          uint *args_3,bool *args_4)

{
  bool bVar1;
  uint32_t uVar2;
  SourceLocation SVar3;
  size_t sVar4;
  char *pcVar5;
  GenerateBlockSymbol *thisSym_;
  
  thisSym_ = (GenerateBlockSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((GenerateBlockSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (GenerateBlockSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar4 = args_1->_M_len;
  pcVar5 = args_1->_M_str;
  SVar3 = *args_2;
  uVar2 = *args_3;
  bVar1 = *args_4;
  (thisSym_->super_Symbol).kind = GenerateBlock;
  (thisSym_->super_Symbol).name._M_len = sVar4;
  (thisSym_->super_Symbol).name._M_str = pcVar5;
  (thisSym_->super_Symbol).location = SVar3;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  thisSym_->constructIndex = uVar2;
  thisSym_->isInstantiated = bVar1;
  thisSym_->arrayIndex = (SVInt *)0x0;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }